

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O3

Tone * Tunings::toneFromString(Tone *__return_storage_ptr__,string *fullLine,int lineno)

{
  double dVar1;
  long lVar2;
  longlong lVar3;
  long *plVar4;
  long *plVar5;
  TuningError *this;
  long *plVar6;
  string s;
  string line;
  long *local_f0;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  __return_storage_ptr__->type = kToneRatio;
  __return_storage_ptr__->cents = 0.0;
  __return_storage_ptr__->ratio_d = 1;
  __return_storage_ptr__->ratio_n = 1;
  (__return_storage_ptr__->stringRep)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->stringRep).field_2;
  *(undefined4 *)&(__return_storage_ptr__->stringRep).field_2 = 0x312f31;
  (__return_storage_ptr__->stringRep)._M_string_length = 3;
  __return_storage_ptr__->floatValue = 1.0;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->stringRep);
  __return_storage_ptr__->lineno = lineno;
  std::__cxx11::string::find((char *)fullLine,0x1071cb,0);
  std::__cxx11::string::substr((ulong)&local_90,(ulong)fullLine);
  lVar2 = std::__cxx11::string::find((char)&local_90,0x2e);
  if (lVar2 == -1) {
    __return_storage_ptr__->type = kToneRatio;
    lVar2 = std::__cxx11::string::find((char)&local_90,0x2f);
    if (lVar2 == -1) {
      lVar2 = atoll(local_90._M_dataplus._M_p);
      __return_storage_ptr__->ratio_n = lVar2;
      __return_storage_ptr__->ratio_d = 1;
      lVar3 = 1;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_90);
      plVar4 = local_d0;
      lVar3 = atoll((char *)local_d0);
      __return_storage_ptr__->ratio_n = lVar3;
      if (plVar4 != local_c0) {
        operator_delete(plVar4,local_c0[0] + 1);
      }
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_90);
      lVar3 = atoll((char *)local_d0);
      __return_storage_ptr__->ratio_d = lVar3;
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
        lVar3 = __return_storage_ptr__->ratio_d;
      }
      lVar2 = __return_storage_ptr__->ratio_n;
    }
    if ((lVar2 == 0) || (lVar3 == 0)) {
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Invalid tone in SCL file.","");
      if (-1 < lineno) {
        std::__cxx11::to_string(&local_70,lineno);
        std::operator+(&local_b0,"Line ",&local_70);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_f0 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_f0 == plVar5) {
          local_e0 = *plVar5;
          lStack_d8 = plVar4[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar5;
        }
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      std::operator+(&local_b0," Line is \'",&local_90);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
      plVar4 = (long *)*plVar5;
      plVar6 = plVar5 + 2;
      if (plVar4 == plVar6) {
        local_e0 = *plVar6;
        lStack_d8 = plVar5[3];
        plVar4 = &local_e0;
      }
      else {
        local_e0 = *plVar6;
      }
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)plVar4);
      if (plVar4 != &local_e0) {
        operator_delete(plVar4,local_e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      this = (TuningError *)__cxa_allocate_exception(0x28);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_d0,local_c8 + (long)local_d0);
      TuningError::TuningError(this,&local_50);
      __cxa_throw(this,&TuningError::typeinfo,TuningError::~TuningError);
    }
    dVar1 = log((double)lVar2 / (double)lVar3);
    dVar1 = (dVar1 * 1200.0) / 0.6931471805599453;
  }
  else {
    __return_storage_ptr__->type = kToneCents;
    dVar1 = locale_atof(local_90._M_dataplus._M_p);
  }
  __return_storage_ptr__->cents = dVar1;
  __return_storage_ptr__->floatValue = dVar1 / 1200.0 + 1.0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Tone toneFromString(const std::string &fullLine, int lineno)
{
    Tone t;
    t.stringRep = fullLine;
    t.lineno = lineno;

    // Allow end-of-line comments, e.g. "555/524 ! c# 138.75 Hz"
    std::string line = fullLine.substr(0, fullLine.find("!", 0));

    if (line.find('.') != std::string::npos)
    {
        t.type = Tone::kToneCents;
        t.cents = locale_atof(line.c_str());
    }
    else
    {
        t.type = Tone::kToneRatio;
        auto slashPos = line.find('/');
        if (slashPos == std::string::npos)
        {
            t.ratio_n = atoll(line.c_str());
            t.ratio_d = 1;
        }
        else
        {
            t.ratio_n = atoll(line.substr(0, slashPos).c_str());
            t.ratio_d = atoll(line.substr(slashPos + 1).c_str());
        }

        if (t.ratio_n == 0 || t.ratio_d == 0)
        {
            std::string s = "Invalid tone in SCL file.";
            if (lineno >= 0)
                s += "Line " + std::to_string(lineno) + ".";
            s += " Line is '" + line + "'.";
            throw TuningError(s);
        }
        // 2^(cents/1200) = n/d
        // cents = 1200 * log(n/d) / log(2)

        t.cents = 1200 * log(1.0 * t.ratio_n / t.ratio_d) / log(2.0);
    }
    t.floatValue = t.cents / 1200.0 + 1.0;
    return t;
}